

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O0

void duckdb::MapExtractListFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  LogicalTypeId LVar2;
  LogicalType *pLVar3;
  list_entry_t *plVar4;
  UnifiedVectorFormat *pUVar5;
  int *piVar6;
  list_entry_t *plVar7;
  idx_t iVar8;
  list_entry_t *plVar9;
  list_entry_t *plVar10;
  unsigned_long uVar11;
  Vector *in_RDX;
  DataChunk *in_RDI;
  unsigned_long pos;
  idx_t pos_idx;
  list_entry_t *out_list;
  list_entry_t *inc_list;
  idx_t lst_idx;
  idx_t row_idx;
  idx_t offset;
  list_entry_t *out_list_data;
  list_entry_t *inc_list_data;
  int *pos_data;
  UnifiedVectorFormat lst_format;
  UnifiedVectorFormat pos_format;
  UnifiedVectorFormat val_format;
  Vector pos_vec;
  Vector *val_vec;
  Vector *key_vec;
  bool arg_is_null;
  bool map_is_null;
  value_type *arg_vec;
  value_type *map_vec;
  idx_t count;
  Vector *in_stack_fffffffffffffd98;
  UnifiedVectorFormat *in_stack_fffffffffffffda0;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  idx_t in_stack_fffffffffffffe18;
  Vector *in_stack_fffffffffffffe20;
  uint64_t uVar12;
  Vector *in_stack_fffffffffffffe28;
  Vector *in_stack_fffffffffffffe30;
  Vector *in_stack_fffffffffffffe38;
  SelectionVector *local_1c0 [9];
  SelectionVector *local_178 [9];
  UnifiedVectorFormat local_130 [88];
  LogicalType local_d8 [24];
  Vector local_c0 [104];
  Vector *local_58;
  undefined8 local_50;
  list_entry_t local_48;
  undefined1 local_32;
  byte local_31;
  reference local_30;
  Vector *local_28;
  UnifiedVectorFormat *local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = (UnifiedVectorFormat *)DataChunk::size(in_RDI);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffda0,
                        (size_type)in_stack_fffffffffffffd98);
  local_30 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffda0,
                        (size_type)in_stack_fffffffffffffd98);
  pLVar3 = Vector::GetType(local_28);
  LVar2 = LogicalType::id(pLVar3);
  local_31 = LVar2 == SQLNULL;
  pLVar3 = Vector::GetType(local_30);
  LVar2 = LogicalType::id(pLVar3);
  local_32 = LVar2 == SQLNULL;
  if (((local_31 & 1) != 0) || ((bool)local_32)) {
    duckdb::ListVector::SetListSize(local_18,0);
    duckdb::Vector::SetVectorType((VectorType)local_18);
    list_entry_t::list_entry_t(&local_48,0,0);
    plVar4 = ConstantVector::GetData<duckdb::list_entry_t>((Vector *)0xd99d15);
    plVar4->offset = local_48.offset;
    plVar4->length = local_48.length;
    duckdb::Vector::Verify((ulong)local_18);
  }
  else {
    local_50 = duckdb::MapVector::GetKeys(local_28);
    local_58 = (Vector *)duckdb::MapVector::GetValues(local_28);
    duckdb::LogicalType::LogicalType(local_d8,INTEGER);
    duckdb::Vector::Vector(local_c0,local_d8,local_20);
    duckdb::LogicalType::~LogicalType(local_d8);
    DataChunk::size(local_8);
    ListSearchOp<true>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                       ,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_130);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_178);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_1c0);
    pVVar1 = local_58;
    pUVar5 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(local_28);
    duckdb::Vector::ToUnifiedFormat((ulong)pVVar1,pUVar5);
    duckdb::Vector::ToUnifiedFormat((ulong)local_c0,local_20);
    duckdb::Vector::ToUnifiedFormat((ulong)local_28,local_20);
    piVar6 = UnifiedVectorFormat::GetData<int>((UnifiedVectorFormat *)local_178);
    plVar4 = ListVector::GetData(in_stack_fffffffffffffd98);
    plVar7 = ListVector::GetData(in_stack_fffffffffffffd98);
    uVar12 = 0;
    for (pUVar5 = (UnifiedVectorFormat *)0x0; pUVar5 < local_20; pUVar5 = pUVar5 + 1) {
      iVar8 = SelectionVector::get_index(local_1c0[0],(idx_t)pUVar5);
      in_stack_fffffffffffffdaf =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_fffffffffffffdaf,
                               CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                      (idx_t)in_stack_fffffffffffffda0);
      if ((bool)in_stack_fffffffffffffdaf) {
        plVar9 = plVar4 + iVar8;
        plVar10 = plVar7 + (long)pUVar5;
        iVar8 = SelectionVector::get_index(local_178[0],(idx_t)pUVar5);
        in_stack_fffffffffffffdae =
             TemplatedValidityMask<unsigned_long>::RowIsValid
                       ((TemplatedValidityMask<unsigned_long> *)
                        CONCAT17(in_stack_fffffffffffffdaf,
                                 CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                        (idx_t)in_stack_fffffffffffffda0);
        if ((bool)in_stack_fffffffffffffdae) {
          in_stack_fffffffffffffda0 = (UnifiedVectorFormat *)plVar9->offset;
          uVar11 = UnsafeNumericCast<unsigned_long,int,void>(piVar6[iVar8] + -1);
          plVar10->offset = uVar12;
          plVar10->length = 1;
          duckdb::ListVector::Append
                    (local_18,local_58,(ulong)(in_stack_fffffffffffffda0 + uVar11 + 1),
                     (ulong)(in_stack_fffffffffffffda0 + uVar11));
          uVar12 = uVar12 + 1;
        }
        else {
          plVar10->offset = uVar12;
          plVar10->length = 0;
        }
      }
      else {
        duckdb::FlatVector::SetNull(local_18,(ulong)pUVar5,true);
      }
    }
    iVar8 = DataChunk::size(local_8);
    if (iVar8 == 1) {
      duckdb::Vector::SetVectorType((VectorType)local_18);
    }
    duckdb::Vector::Verify((ulong)local_18);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffda0);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffda0);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffda0);
    Vector::~Vector((Vector *)in_stack_fffffffffffffda0);
  }
  return;
}

Assistant:

static void MapExtractListFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		ListVector::SetListSize(result, 0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<list_entry_t>(result)[0] = {0, 0};
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	val_vec.ToUnifiedFormat(ListVector::GetListSize(map_vec), val_format);
	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);
	const auto out_list_data = ListVector::GetData(result);

	idx_t offset = 0;
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		const auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		auto &inc_list = inc_list_data[lst_idx];
		auto &out_list = out_list_data[row_idx];

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return emptyl ist
			out_list.offset = offset;
			out_list.length = 0;
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list.offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		out_list.offset = offset;
		out_list.length = 1;
		ListVector::Append(result, val_vec, pos + 1, pos);
		offset++;
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}